

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

size_t lha_check_header_format(void *h)

{
  size_t next_skip_bytes;
  uchar *p;
  void *h_local;
  
  switch(*(undefined1 *)((long)h + 5)) {
  case 0x2d:
    next_skip_bytes = 3;
    break;
  default:
    next_skip_bytes = 4;
    break;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 100:
  case 0x73:
    next_skip_bytes = 4;
    if ((((*h != '\0') && (*(char *)((long)h + 2) == '-')) && (*(char *)((long)h + 3) == 'l')) &&
       (*(char *)((long)h + 6) == '-')) {
      if (*(char *)((long)h + 4) == 'h') {
        if (*(char *)((long)h + 5) == 's') {
          return 4;
        }
        if (*(char *)((long)h + 0x14) == '\0') {
          return 0;
        }
        if ((*(byte *)((long)h + 0x14) < 4) && (*(char *)((long)h + 0x13) == ' ')) {
          return 0;
        }
      }
      if (((*(char *)((long)h + 4) == 'z') && (*(char *)((long)h + 0x14) == '\0')) &&
         ((*(char *)((long)h + 5) == 's' ||
          ((*(char *)((long)h + 5) == '4' || (*(char *)((long)h + 5) == '5')))))) {
        return 0;
      }
    }
    break;
  case 0x68:
    next_skip_bytes = 1;
    break;
  case 0x6c:
    next_skip_bytes = 2;
    break;
  case 0x7a:
    next_skip_bytes = 1;
  }
  return next_skip_bytes;
}

Assistant:

static size_t
lha_check_header_format(const void *h)
{
	const unsigned char *p = h;
	size_t next_skip_bytes;

	switch (p[H_METHOD_OFFSET+3]) {
	/*
	 * "-lh0-" ... "-lh7-" "-lhd-"
	 * "-lzs-" "-lz5-"
	 */
	case '0': case '1': case '2': case '3':
	case '4': case '5': case '6': case '7':
	case 'd':
	case 's':
		next_skip_bytes = 4;

		/* b0 == 0 means the end of an LHa archive file.	*/
		if (p[0] == 0)
			break;
		if (p[H_METHOD_OFFSET] != '-' || p[H_METHOD_OFFSET+1] != 'l'
		    ||  p[H_METHOD_OFFSET+4] != '-')
			break;

		if (p[H_METHOD_OFFSET+2] == 'h') {
			/* "-lh?-" */
			if (p[H_METHOD_OFFSET+3] == 's')
				break;
			if (p[H_LEVEL_OFFSET] == 0)
				return (0);
			if (p[H_LEVEL_OFFSET] <= 3 && p[H_ATTR_OFFSET] == 0x20)
				return (0);
		}
		if (p[H_METHOD_OFFSET+2] == 'z') {
			/* LArc extensions: -lzs-,-lz4- and -lz5- */
			if (p[H_LEVEL_OFFSET] != 0)
				break;
			if (p[H_METHOD_OFFSET+3] == 's'
			    || p[H_METHOD_OFFSET+3] == '4'
			    || p[H_METHOD_OFFSET+3] == '5')
				return (0);
		}
		break;
	case 'h': next_skip_bytes = 1; break;
	case 'z': next_skip_bytes = 1; break;
	case 'l': next_skip_bytes = 2; break;
	case '-': next_skip_bytes = 3; break;
	default : next_skip_bytes = 4; break;
	}

	return (next_skip_bytes);
}